

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delim_get_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::DelimGetRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DelimGetRelation *this,idx_t depth)

{
  reference this_00;
  ulong __n;
  string local_50;
  
  Relation::RenderWhitespace_abi_cxx11_(__return_storage_ptr__,(Relation *)depth,depth);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  __n = 0;
  while (__n < (ulong)(((long)(this->chunk_types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->chunk_types).
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    this_00 = vector<duckdb::LogicalType,_true>::get<true>(&this->chunk_types,__n);
    LogicalType::ToString_abi_cxx11_(&local_50,this_00);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_50);
    __n = __n + 1;
    if (__n < (ulong)(((long)(this->chunk_types).
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->chunk_types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string DelimGetRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth);
	str += "Delimiter Get [";
	for (idx_t i = 0; i < chunk_types.size(); i++) {
		str += chunk_types[i].ToString();
		if (i + 1 < chunk_types.size()) {
			str += ", ";
		}
	}
	str += "]";

	return str;
}